

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# millerrabin.c
# Opt level: O2

mp_int * miller_rabin_find_potential_primitive_root(MillerRabin *mr)

{
  mp_int *pmVar1;
  mr_result mVar2;
  mp_int *pmVar3;
  
  do {
    pmVar1 = mp_random_in_range_fn(mr->two,mr->pm1,random_read);
    pmVar1 = mp_unsafe_shrink(pmVar1);
    mVar2 = miller_rabin_test_inner(mr,pmVar1);
    if ((ulong)mVar2 >> 0x20 != 0 && mVar2.passed != 0) {
      pmVar3 = monty_export(mr->mc,pmVar1);
      mp_free(pmVar1);
      return pmVar3;
    }
    mp_free(pmVar1);
  } while (mVar2.passed != 0);
  return (mp_int *)0x0;
}

Assistant:

mp_int *miller_rabin_find_potential_primitive_root(MillerRabin *mr)
{
    while (true) {
        mp_int *mw = mp_unsafe_shrink(mp_random_in_range(mr->two, mr->pm1));
        struct mr_result result = miller_rabin_test_inner(mr, mw);

        if (result.passed && result.potential_primitive_root) {
            mp_int *pr = monty_export(mr->mc, mw);
            mp_free(mw);
            return pr;
        }

        mp_free(mw);

        if (!result.passed) {
            return NULL;
        }
    }
}